

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_2::SetMessageVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  uint uVar3;
  Type TVar4;
  mapped_type *pmVar5;
  Descriptor *pDVar6;
  char *pcVar7;
  FieldOptions *this;
  int i;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  int bitIndex_05;
  int bitIndex_06;
  int bitIndex_07;
  int bitIndex_08;
  int bitIndex_09;
  int bitIndex_10;
  undefined4 in_register_00000014;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  Descriptor *descriptor_00;
  allocator<char> local_569;
  key_type local_568;
  string local_548;
  allocator<char> local_521;
  key_type local_520;
  string local_500;
  allocator<char> local_4d9;
  key_type local_4d8;
  string local_4b8;
  allocator<char> local_491;
  key_type local_490;
  string local_470;
  allocator<char> local_449;
  key_type local_448;
  string local_428;
  allocator<char> local_401;
  key_type local_400;
  string local_3e0;
  allocator<char> local_3b9;
  key_type local_3b8;
  string local_398;
  allocator<char> local_371;
  key_type local_370;
  string local_350;
  allocator<char> local_329;
  key_type local_328;
  string local_308;
  allocator<char> local_2e1;
  key_type local_2e0;
  string local_2c0;
  allocator<char> local_299;
  key_type local_298;
  string local_278;
  allocator<char> local_251;
  key_type local_250;
  string local_230;
  allocator<char> local_209;
  key_type local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  allocator<char> local_1b9;
  key_type local_1b8;
  allocator<char> local_191;
  key_type local_190;
  string local_170;
  allocator<char> local_149;
  key_type local_148;
  string local_128;
  allocator<char> local_101;
  key_type local_100;
  string local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  allocator<char> local_61;
  key_type local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = variables;
  variables_local._0_4_ = builderBitIndex;
  variables_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  UnderscoresToCamelCase_abi_cxx11_
            (&local_40,(java *)descriptor,
             (FieldDescriptor *)CONCAT44(in_register_00000014,builderBitIndex));
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"name",&local_61);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_60);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_98,(java *)_builderBitIndex_local,field);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"capitalized_name",&local_b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  FieldConstantName_abi_cxx11_(&local_e0,(java *)_builderBitIndex_local,field_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"constant_name",&local_101);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_100);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_e0);
  uVar3 = FieldDescriptor::number(_builderBitIndex_local);
  SimpleItoa_abi_cxx11_(&local_128,(protobuf *)(ulong)uVar3,i);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"number",&local_149);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_148);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_128);
  pDVar6 = FieldDescriptor::message_type(_builderBitIndex_local);
  ClassName_abi_cxx11_(&local_170,(java *)pDVar6,descriptor_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"type",&local_191);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_190);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)&local_170);
  TVar4 = GetType(_builderBitIndex_local);
  pmVar1 = local_20;
  pcVar7 = "Message";
  if (TVar4 == TYPE_GROUP) {
    pcVar7 = "Group";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"group_or_message",&local_1b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1b8);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  this = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(this);
  pmVar1 = local_20;
  pcVar7 = "";
  if (bVar2) {
    pcVar7 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"deprecation",&local_1e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1e0);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  pDVar6 = FieldDescriptor::containing_type(_builderBitIndex_local);
  bVar2 = HasDescriptorMethods(pDVar6);
  pmVar1 = local_20;
  pcVar7 = "";
  if (bVar2) {
    pcVar7 = "onChanged();";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"on_changed",&local_209);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_208);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  GenerateGetBit_abi_cxx11_(&local_230,(java *)(ulong)variables_local._4_4_,bitIndex);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"get_has_field_bit_message",&local_251);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_250);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_230);
  GenerateSetBit_abi_cxx11_(&local_278,(java *)(ulong)variables_local._4_4_,bitIndex_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"set_has_field_bit_message",&local_299);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_298);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_278);
  GenerateGetBit_abi_cxx11_(&local_2c0,(java *)(ulong)(uint)variables_local,bitIndex_01);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"get_has_field_bit_builder",&local_2e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_2e0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2c0);
  GenerateSetBit_abi_cxx11_(&local_308,(java *)(ulong)(uint)variables_local,bitIndex_02);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"set_has_field_bit_builder",&local_329);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_328);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_308);
  GenerateClearBit_abi_cxx11_(&local_350,(java *)(ulong)(uint)variables_local,bitIndex_03);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"clear_has_field_bit_builder",&local_371);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_370);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_350);
  GenerateGetBit_abi_cxx11_(&local_398,(java *)(ulong)(uint)variables_local,bitIndex_04);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"get_mutable_bit_builder",&local_3b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_3b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_398);
  GenerateSetBit_abi_cxx11_(&local_3e0,(java *)(ulong)(uint)variables_local,bitIndex_05);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"set_mutable_bit_builder",&local_401);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_400);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3e0);
  GenerateClearBit_abi_cxx11_(&local_428,(java *)(ulong)(uint)variables_local,bitIndex_06);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"clear_mutable_bit_builder",&local_449);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_448);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string((string *)&local_428);
  GenerateGetBitMutableLocal_abi_cxx11_(&local_470,(java *)(ulong)(uint)variables_local,bitIndex_07)
  ;
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"get_mutable_bit_parser",&local_491);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_490);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_470);
  GenerateSetBitMutableLocal_abi_cxx11_(&local_4b8,(java *)(ulong)(uint)variables_local,bitIndex_08)
  ;
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"set_mutable_bit_parser",&local_4d9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_4d8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b8);
  GenerateGetBitFromLocal_abi_cxx11_(&local_500,(java *)(ulong)(uint)variables_local,bitIndex_09);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"get_has_field_bit_from_local",&local_521);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_520);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::__cxx11::string::~string((string *)&local_500);
  GenerateSetBitToLocal_abi_cxx11_(&local_548,(java *)(ulong)variables_local._4_4_,bitIndex_10);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"set_has_field_bit_to_local",&local_569);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_568);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_548);
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor,
                         int messageBitIndex,
                         int builderBitIndex,
                         map<string, string>* variables) {
  (*variables)["name"] =
    UnderscoresToCamelCase(descriptor);
  (*variables)["capitalized_name"] =
    UnderscoresToCapitalizedCamelCase(descriptor);
  (*variables)["constant_name"] = FieldConstantName(descriptor);
  (*variables)["number"] = SimpleItoa(descriptor->number());
  (*variables)["type"] = ClassName(descriptor->message_type());
  (*variables)["group_or_message"] =
    (GetType(descriptor) == FieldDescriptor::TYPE_GROUP) ?
    "Group" : "Message";
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] =
      HasDescriptorMethods(descriptor->containing_type()) ? "onChanged();" : "";

  // For singular messages and builders, one bit is used for the hasField bit.
  (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
  (*variables)["set_has_field_bit_message"] = GenerateSetBit(messageBitIndex);

  (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_has_field_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_has_field_bit_builder"] =
      GenerateClearBit(builderBitIndex);

  // For repated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}